

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnNtk.c
# Opt level: O2

void Wln_NtkTransferNames(Wln_Ntk_t *pNew,Wln_Ntk_t *p)

{
  int iVar1;
  int iVar2;
  int in_EDX;
  int extraout_EDX;
  int iVar3;
  Vec_Int_t *pVVar4;
  
  if ((pNew->pManName != (Abc_Nam_t *)0x0) || (p->pManName == (Abc_Nam_t *)0x0)) {
    __assert_fail("pNew->pManName == NULL && p->pManName != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                  ,0x113,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
  }
  pNew->pManName = p->pManName;
  p->pManName = (Abc_Nam_t *)0x0;
  if (((pNew->vCopies).nSize < 1) && (0 < (p->vCopies).nSize)) {
    if (0 < (p->vNameIds).nSize) {
      if (0 < (pNew->vNameIds).nSize) {
        __assert_fail("!Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                      ,0x11a,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
      }
      Vec_IntFill(&pNew->vNameIds,(pNew->vTypes).nCap,in_EDX);
      pVVar4 = &p->vNameIds;
      for (iVar3 = 1; iVar3 < (p->vTypes).nSize; iVar3 = iVar3 + 1) {
        iVar1 = Vec_IntEntry(&p->vCopies,iVar3);
        if ((iVar1 != 0) && (iVar3 < (p->vNameIds).nSize)) {
          iVar1 = Vec_IntEntry(pVVar4,iVar3);
          if (iVar1 != 0) {
            iVar1 = Vec_IntEntry(&p->vCopies,iVar3);
            iVar2 = Vec_IntEntry(pVVar4,iVar3);
            Vec_IntWriteEntry(&pNew->vNameIds,iVar1,iVar2);
          }
        }
      }
      Vec_IntErase(pVVar4);
      in_EDX = extraout_EDX;
    }
    if (0 < (p->vInstIds).nSize) {
      if ((pNew->vInstIds).nSize < 1) {
        Vec_IntFill(&pNew->vInstIds,(pNew->vTypes).nCap,in_EDX);
        pVVar4 = &p->vInstIds;
        for (iVar3 = 1; iVar3 < (p->vTypes).nSize; iVar3 = iVar3 + 1) {
          iVar1 = Vec_IntEntry(&p->vCopies,iVar3);
          if ((iVar1 != 0) && (iVar3 < (p->vInstIds).nSize)) {
            iVar1 = Vec_IntEntry(pVVar4,iVar3);
            if (iVar1 != 0) {
              iVar1 = Vec_IntEntry(&p->vCopies,iVar3);
              iVar2 = Vec_IntEntry(pVVar4,iVar3);
              Vec_IntWriteEntry(&pNew->vInstIds,iVar1,iVar2);
            }
          }
        }
        Vec_IntErase(pVVar4);
        return;
      }
      __assert_fail("!Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                    ,0x124,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
    }
    return;
  }
  __assert_fail("!Wln_NtkHasCopy(pNew) && Wln_NtkHasCopy(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/wln/wlnNtk.c"
                ,0x116,"void Wln_NtkTransferNames(Wln_Ntk_t *, Wln_Ntk_t *)");
}

Assistant:

void Wln_NtkTransferNames( Wln_Ntk_t * pNew, Wln_Ntk_t * p )
{
    assert( pNew->pManName  == NULL && p->pManName != NULL );
    pNew->pManName = p->pManName; 
    p->pManName = NULL;
    assert( !Wln_NtkHasCopy(pNew)   && Wln_NtkHasCopy(p)   );
    if ( Wln_NtkHasNameId(p) )
    {
        int i;
        assert( !Wln_NtkHasNameId(pNew) && Wln_NtkHasNameId(p) );
        Wln_NtkCleanNameId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vNameIds) && Wln_ObjNameId(p, i) )
                Wln_ObjSetNameId( pNew, Wln_ObjCopy(p, i), Wln_ObjNameId(p, i) );
        Vec_IntErase( &p->vNameIds );
    }
    if ( Wln_NtkHasInstId(p) )
    {
        int i;
        assert( !Wln_NtkHasInstId(pNew) && Wln_NtkHasInstId(p) );
        Wln_NtkCleanInstId( pNew );
        Wln_NtkForEachObj( p, i ) 
            if ( Wln_ObjCopy(p, i) && i < Vec_IntSize(&p->vInstIds) && Wln_ObjInstId(p, i) )
                Wln_ObjSetInstId( pNew, Wln_ObjCopy(p, i), Wln_ObjInstId(p, i) );
        Vec_IntErase( &p->vInstIds );
    }
}